

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  undefined2 uVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  char *in_RAX;
  char *unaff_RBX;
  char *pcVar5;
  ulong uVar6;
  fill_t<char> *fill;
  ulong uVar7;
  size_t n;
  undefined2 *puVar8;
  
  uVar7 = (ulong)specs->width;
  if ((long)uVar7 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  uVar6 = 4 - (ulong)(f->sign == none);
  n = uVar7 - uVar6;
  if (uVar7 < uVar6 || n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar6 = uVar6 + lVar3;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    puVar2[2] = uVar6;
    puVar8 = (undefined2 *)(lVar3 + puVar2[1]);
    if ((ulong)f->sign != 0) {
      *(undefined1 *)puVar8 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar8 = (undefined2 *)((long)puVar8 + 1);
    }
    uVar1 = *(undefined2 *)f->str;
    *(char *)(puVar8 + 1) = f->str[2];
    *puVar8 = uVar1;
    return;
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar7 = uVar6 + lVar3 + (specs->fill).size_ * n;
  if ((ulong)puVar2[3] < uVar7) {
    (**(code **)*puVar2)(puVar2,uVar7);
  }
  puVar2[2] = uVar7;
  pcVar5 = (char *)(lVar3 + puVar2[1]);
  fill = &specs->fill;
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    pcVar5 = fill<char*,char>(pcVar5,n >> 1,fill);
    if ((ulong)f->sign != 0) {
      *pcVar5 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar5 = pcVar5 + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    pcVar5[2] = f->str[2];
    *(undefined2 *)pcVar5 = uVar1;
    n = n - (n >> 1);
  }
  else {
    if (bVar4 == 2) {
      pcVar5 = fill<char*,char>(pcVar5,n,fill);
      if ((ulong)f->sign != 0) {
        *pcVar5 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        pcVar5 = pcVar5 + 1;
      }
      uVar1 = *(undefined2 *)f->str;
      pcVar5[2] = f->str[2];
      *(undefined2 *)pcVar5 = uVar1;
      return;
    }
    if ((ulong)f->sign != 0) {
      *pcVar5 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar5 = pcVar5 + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    pcVar5[2] = f->str[2];
    *(undefined2 *)pcVar5 = uVar1;
  }
  fill<char*,char>(pcVar5 + 3,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }